

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O3

int CVmObjByteArray::static_packBytes(vm_val_t *retval,uint *oargc)

{
  CVmObjPageEntry *pCVar1;
  long lVar2;
  void *pvVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  CVmMemorySource *this;
  undefined4 extraout_var;
  uint argc;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  uint local_110 [2];
  long local_108;
  void *local_100;
  __jmp_buf_tag local_f8;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if (static_packBytes(vm_val_t*,unsigned_int*)::desc == '\0') {
    static_packBytes();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,oargc,&static_packBytes::desc);
  if (iVar4 == 0) {
    this = (CVmMemorySource *)operator_new(0x10);
    CVmMemorySource::CVmMemorySource(this,0);
    G_err_frame::__tls_init();
    local_108 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_110;
    local_110[0] = _setjmp(&local_f8);
    if (local_110[0] == 0) {
      CVmPack::pack(0,argc,(CVmDataSource *)this);
      iVar4 = (*(this->super_CVmDataSource)._vptr_CVmDataSource[6])(this);
      vVar5 = create(0,CONCAT44(extraout_var,iVar4));
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar5;
      pCVar1 = G_obj_table_X.pages_[vVar5 >> 0xc];
      (*(this->super_CVmDataSource)._vptr_CVmDataSource[8])(this,0,0);
      read_from_file((CVmObjByteArray *)((long)&pCVar1->ptr_ + (ulong)((vVar5 & 0xfff) * 0x18)),
                     (retval->val).obj,(CVmDataSource *)this,1,CONCAT44(extraout_var,iVar4),0);
    }
    if (-1 < (short)local_110[0]) {
      local_110[0] = local_110[0] | 0x8000;
      (*(this->super_CVmDataSource)._vptr_CVmDataSource[1])(this);
    }
    lVar2 = local_108;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar2;
    if ((local_110[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar3 = local_100;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar3;
      err_rethrow();
    }
    if ((local_110[0] & 2) != 0) {
      free(local_100);
    }
    sp_ = sp_ + -(long)(int)argc;
  }
  return 1;
}

Assistant:

int CVmObjByteArray::static_packBytes(VMG_ vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = oargc != 0 ? *oargc : 0;
    static CVmNativeCodeDesc desc(1, 0, TRUE);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* set up an in-memory data stream to receive the packed data */
    CVmMemorySource *dst = new CVmMemorySource(0L);

    err_try
    {
        /* do the packing */
        CVmPack::pack(vmg_ 0, argc, dst);

        /* create a byte array to hold the packed data */
        long len = dst->get_size();
        retval->set_obj(create(vmg_ FALSE, len));
        CVmObjByteArray *arr = (CVmObjByteArray *)vm_objp(vmg_ retval->val.obj);

        /* 
         *   copy the bytes from the stream to the byte array; it's a new
         *   object, so there's no undo to save 
         */
        dst->seek(0, OSFSK_SET);
        arr->read_from_file(vmg_ retval->val.obj, dst, 1, len, FALSE);
    }